

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O0

void array_container_andnot
               (array_container_t *array_1,array_container_t *array_2,array_container_t *out)

{
  uint uVar1;
  int32_t iVar2;
  int iVar3;
  uint16_t *in_RDX;
  uint16_t *in_RSI;
  uint16_t *in_RDI;
  uint16_t *in_stack_00000018;
  uint16_t *in_stack_000000f8;
  size_t in_stack_00000100;
  uint16_t *in_stack_00000108;
  size_t in_stack_00000110;
  uint16_t *in_stack_00000118;
  
  if (*(int *)(in_RDX + 2) < *(int *)in_RDI) {
    array_container_grow(out,(int32_t)((ulong)in_RDI >> 0x20),SUB81((ulong)in_RDI >> 0x18,0));
  }
  uVar1 = croaring_hardware_support();
  if ((((uVar1 & 1) == 0) || (in_RDX == in_RDI)) || (in_RDX == in_RSI)) {
    iVar3 = difference_uint16(in_stack_00000018,array_1._4_4_,(uint16_t *)array_2,out._4_4_,in_RDI);
    *(int *)in_RDX = iVar3;
  }
  else {
    iVar2 = difference_vector16(in_stack_00000118,in_stack_00000110,in_stack_00000108,
                                in_stack_00000100,in_stack_000000f8);
    *(int32_t *)in_RDX = iVar2;
  }
  return;
}

Assistant:

void array_container_andnot(const array_container_t *array_1,
                            const array_container_t *array_2,
                            array_container_t *out) {
    if (out->capacity < array_1->cardinality)
        array_container_grow(out, array_1->cardinality, false);
#if CROARING_IS_X64
    if ((croaring_hardware_support() & ROARING_SUPPORTS_AVX2) &&
        (out != array_1) && (out != array_2)) {
        out->cardinality = difference_vector16(
            array_1->array, array_1->cardinality, array_2->array,
            array_2->cardinality, out->array);
    } else {
        out->cardinality =
            difference_uint16(array_1->array, array_1->cardinality,
                              array_2->array, array_2->cardinality, out->array);
    }
#else
    out->cardinality =
        difference_uint16(array_1->array, array_1->cardinality, array_2->array,
                          array_2->cardinality, out->array);
#endif
}